

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

size_t duckdb_je_xallocx(void *ptr,size_t size,size_t extra,int flags)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t oldsize;
  uint64_t uVar4;
  undefined8 uVar5;
  bool bVar6;
  _Bool _Var7;
  uintptr_t uVar8;
  tsd_t *tsd;
  rtree_leaf_elm_t *prVar9;
  long lVar10;
  _Bool _Var11;
  ulong uVar13;
  uintptr_t uVar14;
  uint uVar15;
  rtree_ctx_t *prVar16;
  ulong uVar17;
  rtree_ctx_t rtree_ctx_fallback;
  byte bVar12;
  
  _Var7 = duckdb_je_opt_zero;
  bVar12 = (byte)((flags & 0x40U) >> 6);
  _Var11 = (_Bool)(bVar12 | duckdb_je_opt_zero);
  tsd = (tsd_t *)__tls_get_addr();
  if (((tsd->state).repr == '\0') ||
     (tsd = duckdb_je_tsd_fetch_slow(tsd,false), tsd != (tsd_t *)0x0)) {
    prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    bVar6 = false;
  }
  else {
    prVar16 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar16);
    bVar6 = true;
    tsd = (tsd_t *)0x0;
  }
  uVar15 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  uVar17 = (ulong)ptr & 0xffffffffc0000000;
  uVar13 = (ulong)(uVar15 << 4);
  puVar1 = (ulong *)((long)&prVar16->cache[0].leafkey + uVar13);
  uVar14 = *(uintptr_t *)((long)&prVar16->cache[0].leafkey + uVar13);
  if (uVar14 != uVar17) {
    if (prVar16->l2_cache[0].leafkey == uVar17) {
      prVar9 = prVar16->l2_cache[0].leaf;
      prVar16->l2_cache[0].leafkey = uVar14;
      prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
      *puVar1 = uVar17;
      puVar1[1] = (ulong)prVar9;
    }
    else {
      lVar10 = 0x118;
      do {
        if (*(ulong *)((long)prVar16->cache + lVar10 + -8) == uVar17) {
          uVar13 = *(ulong *)((long)&prVar16->cache[0].leafkey + lVar10);
          puVar2 = (undefined8 *)((long)prVar16->cache + lVar10 + -0x18);
          uVar5 = puVar2[1];
          puVar3 = (undefined8 *)((long)prVar16->cache + lVar10 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar5;
          *(uintptr_t *)((long)prVar16->cache + lVar10 + -0x18) = uVar14;
          *(ulong *)((long)(prVar16->cache + -1) + lVar10) = puVar1[1];
          *puVar1 = uVar17;
          puVar1[1] = uVar13;
          goto LAB_00ce10bb;
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x188);
      duckdb_je_rtree_leaf_elm_lookup_hard
                ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,(uintptr_t)ptr,true,false)
      ;
    }
  }
LAB_00ce10bb:
  if (bVar6) {
    prVar16 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar16);
  }
  else {
    prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar13 = (ulong)(uVar15 << 4);
  puVar1 = (ulong *)((long)&prVar16->cache[0].leafkey + uVar13);
  uVar14 = *(uintptr_t *)((long)&prVar16->cache[0].leafkey + uVar13);
  if (uVar14 == uVar17) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (prVar16->l2_cache[0].leafkey == uVar17) {
    prVar9 = prVar16->l2_cache[0].leaf;
    prVar16->l2_cache[0].leafkey = uVar14;
    prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar17;
    puVar1[1] = (ulong)prVar9;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar10 = 0x118;
    do {
      if (*(ulong *)((long)prVar16->cache + lVar10 + -8) == uVar17) {
        uVar13 = *(ulong *)((long)&prVar16->cache[0].leafkey + lVar10);
        puVar2 = (undefined8 *)((long)prVar16->cache + lVar10 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)prVar16->cache + lVar10 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(uintptr_t *)((long)prVar16->cache + lVar10 + -0x18) = uVar14;
        *(ulong *)((long)(prVar16->cache + -1) + lVar10) = puVar1[1];
        *puVar1 = uVar17;
        puVar1[1] = uVar13;
        prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar13);
        goto LAB_00ce10f6;
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x188);
    prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                       ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,(uintptr_t)ptr,true
                        ,false);
  }
LAB_00ce10f6:
  oldsize = duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
  uVar14 = oldsize;
  if (size < 0x7000000000000001) {
    uVar13 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
    if (0x7000000000000000 - size < extra) {
      extra = 0x7000000000000000 - size;
    }
    if ((((uVar13 == 0) || ((uVar13 - 1 & (ulong)ptr) == 0)) &&
        (_Var11 = duckdb_je_arena_ralloc_no_move
                            ((tsdn_t *)tsd,ptr,oldsize,size,extra,_Var11,
                             (size_t *)&rtree_ctx_fallback),
        uVar8 = rtree_ctx_fallback.cache[0].leafkey, !_Var11)) &&
       (rtree_ctx_fallback.cache[0].leafkey != oldsize)) {
      rtree_ctx_fallback.cache[0].leafkey = CONCAT71(rtree_ctx_fallback.cache[0].leafkey._1_7_,1);
      rtree_ctx_fallback.cache[0].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      rtree_ctx_fallback.cache[1].leafkey =
           (uintptr_t)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
      rtree_ctx_fallback.cache[1].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
      rtree_ctx_fallback.cache[2].leafkey =
           (uintptr_t)
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
      uVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar4 + uVar8;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
          uVar4 <= uVar8) {
        duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
      }
      rtree_ctx_fallback.cache[0].leafkey = rtree_ctx_fallback.cache[0].leafkey & 0xffffffffffffff00
      ;
      rtree_ctx_fallback.cache[0].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      rtree_ctx_fallback.cache[1].leafkey =
           (uintptr_t)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event
      ;
      rtree_ctx_fallback.cache[1].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
      ;
      rtree_ctx_fallback.cache[2].leafkey =
           (uintptr_t)
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
      ;
      uVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated =
           uVar4 + oldsize;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
          uVar4 <= oldsize) {
        duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
      }
      uVar14 = uVar8;
      if ((duckdb_je_opt_junk_alloc == true) &&
         ((oldsize <= uVar8 && uVar8 - oldsize != 0) && (bVar12 == 0 && !_Var7))) {
        switchD_012e5a64::default((void *)((long)ptr + oldsize),0xa5,uVar8 - oldsize);
      }
    }
  }
  if ((tsd->state).repr != '\0') {
    rtree_ctx_fallback.cache[1].leaf = (rtree_leaf_elm_t *)(long)flags;
    rtree_ctx_fallback.cache[0].leafkey = (uintptr_t)ptr;
    rtree_ctx_fallback.cache[0].leaf = (rtree_leaf_elm_t *)size;
    rtree_ctx_fallback.cache[1].leafkey = extra;
    duckdb_je_hook_invoke_expand
              (hook_expand_xallocx,ptr,oldsize,uVar14,uVar14,(uintptr_t *)&rtree_ctx_fallback);
  }
  return uVar14;
}

Assistant:

JEMALLOC_NOTHROW
je_xallocx(void *ptr, size_t size, size_t extra, int flags) {
	tsd_t *tsd;
	size_t usize, old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	LOG("core.xallocx.entry", "ptr: %p, size: %zu, extra: %zu, "
	    "flags: %d", ptr, size, extra, flags);

	assert(ptr != NULL);
	assert(size != 0);
	assert(SIZE_T_MAX - size >= extra);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	/*
	 * old_edata is only for verifying that xallocx() keeps the edata_t
	 * object associated with the ptr (though the content of the edata_t
	 * object can be changed).
	 */
	edata_t *old_edata = emap_edata_lookup(tsd_tsdn(tsd),
	    &arena_emap_global, ptr);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	/*
	 * The API explicitly absolves itself of protecting against (size +
	 * extra) numerical overflow, but we may need to clamp extra to avoid
	 * exceeding SC_LARGE_MAXCLASS.
	 *
	 * Ordinarily, size limit checking is handled deeper down, but here we
	 * have to check as part of (size + extra) clamping, since we need the
	 * clamped value in the above helper functions.
	 */
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		usize = old_usize;
		goto label_not_resized;
	}
	if (unlikely(SC_LARGE_MAXCLASS - size < extra)) {
		extra = SC_LARGE_MAXCLASS - size;
	}

	if (config_prof && opt_prof) {
		usize = ixallocx_prof(tsd, ptr, old_usize, size, extra,
		    alignment, zero, &alloc_ctx);
	} else {
		usize = ixallocx_helper(tsd_tsdn(tsd), ptr, old_usize, size,
		    extra, alignment, zero);
	}

	/*
	 * xallocx() should keep using the same edata_t object (though its
	 * content can be changed).
	 */
	assert(emap_edata_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr)
	    == old_edata);

	if (unlikely(usize == old_usize)) {
		goto label_not_resized;
	}
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize &&
	    !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)ptr + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}
label_not_resized:
	if (unlikely(!tsd_fast(tsd))) {
		uintptr_t args[4] = {(uintptr_t)ptr, size, extra, flags};
		hook_invoke_expand(hook_expand_xallocx, ptr, old_usize,
		    usize, (uintptr_t)usize, args);
	}

	UTRACE(ptr, size, ptr);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.xallocx.exit", "result: %zu", usize);
	return usize;
}